

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

AltNode * __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_false>::AppendSurrogatePairToDisjunction
          (Parser<NullTerminatedUnicodeEncodingPolicy,_false> *this,codepoint_t codePoint,
          AltNode *lastAltNode)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar1;
  AltNode *this_00;
  Node *head;
  TrackAllocData local_58;
  AltNode *tailNode;
  char16 upper;
  AltNode *pAStack_20;
  char16 lower;
  AltNode *lastAltNode_local;
  Parser<NullTerminatedUnicodeEncodingPolicy,_false> *pPStack_10;
  codepoint_t codePoint_local;
  Parser<NullTerminatedUnicodeEncodingPolicy,_false> *this_local;
  
  pAStack_20 = lastAltNode;
  lastAltNode_local._4_4_ = codePoint;
  pPStack_10 = this;
  Js::NumberUtilities::CodePointAsSurrogatePair
            (codePoint,(char16 *)((long)&tailNode + 6),(char16 *)((long)&tailNode + 4));
  pAVar1 = &this->ctAllocator->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&AltNode::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
             ,0x226);
  pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar1,&local_58);
  this_00 = (AltNode *)new<Memory::ArenaAllocator>(0x60,(ArenaAllocator *)pAVar1,0x3f67b0);
  head = CreateSurrogatePairAtom(this,tailNode._6_2_,tailNode._4_2_);
  AltNode::AltNode(this_00,head,(AltNode *)0x0);
  if (pAStack_20 != (AltNode *)0x0) {
    pAStack_20->tail = this_00;
  }
  return this_00;
}

Assistant:

AltNode* Parser<P, IsLiteral>::AppendSurrogatePairToDisjunction(codepoint_t codePoint, AltNode *lastAltNode)
    {
        char16 lower, upper;
        Js::NumberUtilities::CodePointAsSurrogatePair(codePoint, &lower, &upper);

        AltNode* tailNode = Anew(ctAllocator, AltNode, CreateSurrogatePairAtom(lower, upper), nullptr);

        if (lastAltNode != nullptr)
        {
            lastAltNode->tail = tailNode;
        }

        return tailNode;
    }